

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commodore.cpp
# Opt level: O0

void __thiscall Storage::Tape::Commodore::Parser::Parser(Parser *this)

{
  Parser *this_local;
  
  memset(this,0,0x30);
  PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ::PulseClassificationParser
            (&this->
              super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
            );
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>._vptr_Parser =
       (_func_int **)&PTR_process_pulse_00cab7e0;
  this->parity_byte_ = '\0';
  this->previous_was_high_ = false;
  this->wave_period_ = 0.0;
  return;
}

Assistant:

Parser::Parser() :
	Storage::Tape::PulseClassificationParser<WaveType, SymbolType>() {}